

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::ColorEditOptionsPopup(float *col,ImGuiColorEditFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  int iVar16;
  int local_8c;
  ImVec2 local_80;
  char buf [64];
  
  if ((flags & 0x700000U) != 0 && (flags & 0x1800000U) != 0) {
    return;
  }
  bVar6 = BeginPopup("context",0);
  pIVar5 = GImGui;
  if (!bVar6) {
    return;
  }
  uVar8 = GImGui->ColorEditOptions;
  if ((flags & 0x700000U) == 0) {
    bVar6 = RadioButton("RGB",(bool)((byte)(uVar8 >> 0x14) & 1));
    uVar7 = (uVar8 & 0xff8fffff) + 0x100000;
    if (!bVar6) {
      uVar7 = uVar8;
    }
    bVar6 = RadioButton("HSV",(bool)((byte)(uVar7 >> 0x15) & 1));
    uVar9 = uVar8 & 0xff8fffff | 0x200000;
    if (!bVar6) {
      uVar9 = uVar7;
    }
    bVar6 = RadioButton("Hex",(bool)((byte)(uVar9 >> 0x16) & 1));
    uVar8 = uVar9 & 0xff8fffff | 0x400000;
    if (!bVar6) {
      uVar8 = uVar9;
    }
    if ((flags & 0x1800000U) != 0) goto LAB_00171718;
    Separator();
  }
  else if ((flags & 0x1800000U) != 0) goto LAB_00171718;
  bVar6 = RadioButton("0..255",(bool)((byte)(uVar8 >> 0x17) & 1));
  uVar7 = (uVar8 & 0xfe7fffff) + 0x800000;
  if (!bVar6) {
    uVar7 = uVar8;
  }
  bVar6 = RadioButton("0.00..1.00",(bool)((byte)(uVar7 >> 0x18) & 1));
  uVar8 = uVar8 & 0xfe7fffff | 0x1000000;
  if (!bVar6) {
    uVar8 = uVar7;
  }
LAB_00171718:
  Separator();
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = -0x80;
  buf[3] = -0x41;
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  bVar6 = Button("Copy as..",(ImVec2 *)buf);
  if (bVar6) {
    OpenPopup("Copy",0);
  }
  bVar6 = BeginPopup("Copy",0);
  if (bVar6) {
    fVar1 = *col;
    fVar2 = col[1];
    fVar11 = 1.0;
    if (fVar1 <= 1.0) {
      fVar11 = fVar1;
    }
    fVar14 = 1.0;
    if (fVar2 <= 1.0) {
      fVar14 = fVar2;
    }
    fVar3 = col[2];
    fVar15 = 1.0;
    if (fVar3 <= 1.0) {
      fVar15 = fVar3;
    }
    if ((flags & 2U) == 0) {
      fVar4 = col[3];
      fVar13 = 1.0;
      if (fVar4 <= 1.0) {
        fVar13 = fVar4;
      }
      dVar12 = (double)fVar4;
      local_8c = (int)((float)(~-(uint)(fVar4 < 0.0) & (uint)fVar13) * 255.0 + 0.5);
    }
    else {
      dVar12 = 1.0;
      local_8c = 0xff;
    }
    uVar7 = (uint)((float)(~-(uint)(fVar1 < 0.0) & (uint)fVar11) * 255.0 + 0.5);
    uVar9 = (uint)((float)(~-(uint)(fVar2 < 0.0) & (uint)fVar14) * 255.0 + 0.5);
    uVar10 = (uint)((float)(~-(uint)(fVar3 < 0.0) & (uint)fVar15) * 255.0 + 0.5);
    ImFormatString(buf,0x40,"(%.3ff, %.3ff, %.3ff, %.3ff)",(double)fVar1,(double)fVar2,(double)fVar3
                   ,dVar12);
    local_80.x = 0.0;
    local_80.y = 0.0;
    bVar6 = Selectable(buf,false,0,&local_80);
    if (bVar6) {
      SetClipboardText(buf);
    }
    iVar16 = local_8c;
    ImFormatString(buf,0x40,"(%d,%d,%d,%d)",(ulong)uVar7,(ulong)uVar9,(ulong)uVar10,local_8c);
    local_80.x = 0.0;
    local_80.y = 0.0;
    bVar6 = Selectable(buf,false,0,&local_80);
    if (bVar6) {
      SetClipboardText(buf);
    }
    ImFormatString(buf,0x40,"#%02X%02X%02X",(ulong)uVar7,(ulong)uVar9,(ulong)uVar10,iVar16);
    local_80.x = 0.0;
    local_80.y = 0.0;
    bVar6 = Selectable(buf,false,0,&local_80);
    if (bVar6) {
      SetClipboardText(buf);
    }
    if ((flags & 2U) == 0) {
      ImFormatString(buf,0x40,"#%02X%02X%02X%02X",(ulong)uVar7,(ulong)uVar9,(ulong)uVar10,local_8c);
      local_80.x = 0.0;
      local_80.y = 0.0;
      bVar6 = Selectable(buf,false,0,&local_80);
      if (bVar6) {
        SetClipboardText(buf);
      }
    }
    EndPopup();
  }
  pIVar5->ColorEditOptions = uVar8;
  EndPopup();
  return;
}

Assistant:

void ImGui::ColorEditOptionsPopup(const float* col, ImGuiColorEditFlags flags)
{
    bool allow_opt_inputs = !(flags & ImGuiColorEditFlags_DisplayMask_);
    bool allow_opt_datatype = !(flags & ImGuiColorEditFlags_DataTypeMask_);
    if ((!allow_opt_inputs && !allow_opt_datatype) || !BeginPopup("context"))
        return;
    ImGuiContext& g = *GImGui;
    ImGuiColorEditFlags opts = g.ColorEditOptions;
    if (allow_opt_inputs)
    {
        if (RadioButton("RGB", (opts & ImGuiColorEditFlags_DisplayRGB) != 0)) opts = (opts & ~ImGuiColorEditFlags_DisplayMask_) | ImGuiColorEditFlags_DisplayRGB;
        if (RadioButton("HSV", (opts & ImGuiColorEditFlags_DisplayHSV) != 0)) opts = (opts & ~ImGuiColorEditFlags_DisplayMask_) | ImGuiColorEditFlags_DisplayHSV;
        if (RadioButton("Hex", (opts & ImGuiColorEditFlags_DisplayHex) != 0)) opts = (opts & ~ImGuiColorEditFlags_DisplayMask_) | ImGuiColorEditFlags_DisplayHex;
    }
    if (allow_opt_datatype)
    {
        if (allow_opt_inputs) Separator();
        if (RadioButton("0..255",     (opts & ImGuiColorEditFlags_Uint8) != 0)) opts = (opts & ~ImGuiColorEditFlags_DataTypeMask_) | ImGuiColorEditFlags_Uint8;
        if (RadioButton("0.00..1.00", (opts & ImGuiColorEditFlags_Float) != 0)) opts = (opts & ~ImGuiColorEditFlags_DataTypeMask_) | ImGuiColorEditFlags_Float;
    }

    if (allow_opt_inputs || allow_opt_datatype)
        Separator();
    if (Button("Copy as..", ImVec2(-1, 0)))
        OpenPopup("Copy");
    if (BeginPopup("Copy"))
    {
        int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
        char buf[64];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%.3ff, %.3ff, %.3ff, %.3ff)", col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%d,%d,%d,%d)", cr, cg, cb, ca);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X", cr, cg, cb);
        if (Selectable(buf))
            SetClipboardText(buf);
        if (!(flags & ImGuiColorEditFlags_NoAlpha))
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X%02X", cr, cg, cb, ca);
            if (Selectable(buf))
                SetClipboardText(buf);
        }
        EndPopup();
    }

    g.ColorEditOptions = opts;
    EndPopup();
}